

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O0

void __thiscall Fl_Table::recalc_dimensions(Fl_Table *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Fl_Boxtype FVar4;
  int iVar5;
  int scrollsize;
  int hideh;
  int hidev;
  Fl_Table *this_local;
  
  iVar3 = Fl_Widget::x((Fl_Widget *)this);
  FVar4 = Fl_Widget::box((Fl_Widget *)this);
  iVar5 = Fl::box_dx(FVar4);
  this->wix = iVar3 + iVar5;
  this->tox = this->wix;
  iVar3 = this->tox;
  FVar4 = Fl_Widget::box((Fl_Widget *)this->table);
  iVar5 = Fl::box_dx(FVar4);
  this->tix = iVar3 + iVar5;
  iVar3 = Fl_Widget::y((Fl_Widget *)this);
  FVar4 = Fl_Widget::box((Fl_Widget *)this);
  iVar5 = Fl::box_dy(FVar4);
  this->wiy = iVar3 + iVar5;
  this->toy = this->wiy;
  iVar3 = this->toy;
  FVar4 = Fl_Widget::box((Fl_Widget *)this->table);
  iVar5 = Fl::box_dy(FVar4);
  this->tiy = iVar3 + iVar5;
  iVar3 = Fl_Widget::w((Fl_Widget *)this);
  FVar4 = Fl_Widget::box((Fl_Widget *)this);
  iVar5 = Fl::box_dw(FVar4);
  this->wiw = iVar3 - iVar5;
  this->tow = this->wiw;
  iVar3 = this->tow;
  FVar4 = Fl_Widget::box((Fl_Widget *)this->table);
  iVar5 = Fl::box_dw(FVar4);
  this->tiw = iVar3 - iVar5;
  iVar3 = Fl_Widget::h((Fl_Widget *)this);
  FVar4 = Fl_Widget::box((Fl_Widget *)this);
  iVar5 = Fl::box_dh(FVar4);
  this->wih = iVar3 - iVar5;
  this->toh = this->wih;
  iVar3 = this->toh;
  FVar4 = Fl_Widget::box((Fl_Widget *)this->table);
  iVar5 = Fl::box_dh(FVar4);
  this->tih = iVar3 - iVar5;
  iVar3 = col_header(this);
  if (iVar3 != 0) {
    iVar3 = col_header_height(this);
    this->tiy = iVar3 + this->tiy;
    iVar3 = col_header_height(this);
    this->toy = iVar3 + this->toy;
    iVar3 = col_header_height(this);
    this->tih = this->tih - iVar3;
    iVar3 = col_header_height(this);
    this->toh = this->toh - iVar3;
  }
  iVar3 = row_header(this);
  if (iVar3 != 0) {
    iVar3 = row_header_width(this);
    this->tix = iVar3 + this->tix;
    iVar3 = row_header_width(this);
    this->tox = iVar3 + this->tox;
    iVar3 = row_header_width(this);
    this->tiw = this->tiw - iVar3;
    iVar3 = row_header_width(this);
    this->tow = this->tow - iVar3;
  }
  bVar1 = this->table_h <= this->tih;
  bVar2 = this->table_w <= this->tiw;
  iVar3 = Fl::scrollbar_size();
  if ((!bVar2) && (bVar1)) {
    bVar1 = (this->table_h - this->tih) + iVar3 < 1;
  }
  if ((!bVar1) && (bVar2)) {
    bVar2 = (this->table_w - this->tiw) + iVar3 < 1;
  }
  if (bVar1) {
    (*(this->vscrollbar->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget[6])();
  }
  else {
    (*(this->vscrollbar->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget[5])();
    this->tiw = this->tiw - iVar3;
    this->tow = this->tow - iVar3;
  }
  if (bVar2) {
    (*(this->hscrollbar->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget[6])();
  }
  else {
    (*(this->hscrollbar->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget[5])();
    this->tih = this->tih - iVar3;
    this->toh = this->toh - iVar3;
  }
  (*(this->table->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[4])
            (this->table,(ulong)(uint)this->tox,(ulong)(uint)this->toy,(ulong)(uint)this->tow,
             (ulong)(uint)this->toh);
  Fl_Group::init_sizes(&this->table->super_Fl_Group);
  return;
}

Assistant:

void Fl_Table::recalc_dimensions() {
  // Recalc to* (Table Outer), ti* (Table Inner), wi* ( Widget Inner)
  wix = ( x() + Fl::box_dx(box())); tox = wix; tix = tox + Fl::box_dx(table->box());
  wiy = ( y() + Fl::box_dy(box())); toy = wiy; tiy = toy + Fl::box_dy(table->box());
  wiw = ( w() - Fl::box_dw(box())); tow = wiw; tiw = tow - Fl::box_dw(table->box());
  wih = ( h() - Fl::box_dh(box())); toh = wih; tih = toh - Fl::box_dh(table->box());
  // Trim window if headers enabled
  if ( col_header() ) {
    tiy += col_header_height(); toy += col_header_height();
    tih -= col_header_height(); toh -= col_header_height();
  }
  if ( row_header() ) {
    tix += row_header_width(); tox += row_header_width();
    tiw -= row_header_width(); tow -= row_header_width();
  } 
  // Make scroll bars disappear if window large enough
  {
    // First pass: can hide via window size?
    int hidev = (table_h <= tih);
    int hideh = (table_w <= tiw); 
#if FLTK_ABI_VERSION >= 10301
    // NEW
    int scrollsize = _scrollbar_size ? _scrollbar_size : Fl::scrollbar_size();
#else
    // OLD
    int scrollsize = Fl::scrollbar_size();
#endif
    // Second pass: Check for interference
    if ( !hideh && hidev ) { hidev = (( table_h - tih + scrollsize ) <= 0 ); }
    if ( !hidev && hideh ) { hideh = (( table_w - tiw + scrollsize ) <= 0 ); }
    // Determine scrollbar visibility, trim ti[xywh]/to[xywh]
    if ( hidev ) { vscrollbar->hide(); }
    else { vscrollbar->show(); tiw -= scrollsize; tow -= scrollsize; }
    if ( hideh ) { hscrollbar->hide(); }
    else { hscrollbar->show(); tih -= scrollsize; toh -= scrollsize; }
  }
  // Resize the child table
  table->resize(tox, toy, tow, toh);
  table->init_sizes();
}